

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dat.c
# Opt level: O1

uint datsiz(dattyp typ,void *val)

{
  switch(typ) {
  case 1:
    return 4;
  case 2:
  case 10:
  case 0xd:
  case 0xf:
  case 0x10:
    return 2;
  case 3:
  case 7:
  case 9:
    return (uint)*val;
  default:
    return 0;
  case 0xb:
    return (uint)*val * 10 + 1;
  case 0x11:
    return (uint)*val * 0x10 + 1;
  }
}

Assistant:

uint datsiz(dattyp typ, void *val)
{
    switch(typ)
    {
    case DAT_NUMBER:
        return(4);                /* numbers are in 4-byte lsb-first format */

    case DAT_OBJECT:
        return(2);         /* object numbers are in 2-byte lsb-first format */

    case DAT_SSTRING:
    case DAT_DSTRING:
    case DAT_LIST:
        return(osrp2((char *)val));

    case DAT_NIL:
    case DAT_TRUE:
        return(0);

    case DAT_PROPNUM:
    case DAT_SYN:
    case DAT_FNADDR:
    case DAT_REDIR:
        return(2);
        
    case DAT_TPL:
        /* template is counted array of 10-byte entries, plus length byte */
        return(1 + ((*(uchar *)val) * VOCTPLSIZ));

    case DAT_TPL2:
        return(1 + ((*(uchar *)val) * VOCTPL2SIZ));

    default:
        return(0);
    }
}